

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
::
basic_methods_impl_mixin<unsigned_long&,std::function<void(std::__cxx11::string_const&)>&,std::function<void(std::exception_const&)>&>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
           *this,unsigned_long *args,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *args_1,function<void_(const_std::exception_&)> *args_2)

{
  size_t initial_heap_capacity;
  _Any_data _Stack_58;
  _Manager_type local_48;
  _Any_data local_38;
  _Manager_type local_28;
  
  initial_heap_capacity = *args;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_38,args_1);
  std::function<void_(const_std::exception_&)>::function
            ((function<void_(const_std::exception_&)> *)&_Stack_58,args_2);
  timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::timer_heap_engine((timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                       *)this,initial_heap_capacity,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_38,(function<void_(const_std::exception_&)> *)&_Stack_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

basic_methods_impl_mixin(
		ARGS && ... args )
		:	m_engine( std::forward< ARGS >(args)... )
	{
	}